

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxClassPtrCast::Resolve(FxClassPtrCast *this,FCompileContext *ctx)

{
  PClassPointer *dtype;
  PType *pPVar1;
  FxExpression *pFVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  MetaClass *pMVar5;
  FxClassTypeCast *this_00;
  undefined4 extraout_var_00;
  char *pcVar6;
  char *pcVar7;
  FCompileContext *size;
  FxExpression *x_2;
  FxExpression *x_1;
  PClassPointer *from;
  PClassPointer *to;
  FxExpression *x;
  FCompileContext *ctx_local;
  FxClassPtrCast *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    size = ctx;
    if (this->basex != (FxExpression *)0x0) {
      iVar4 = (*this->basex->_vptr_FxExpression[2])();
      this->basex = (FxExpression *)CONCAT44(extraout_var,iVar4);
    }
    if (this->basex == (FxExpression *)0x0) {
      if (this != (FxClassPtrCast *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxClassPtrCast *)0x0;
    }
    else if ((PPointer *)this->basex->ValueType == TypeNullPtr) {
      this->basex->ValueType = (this->super_FxExpression).ValueType;
      this_local = (FxClassPtrCast *)this->basex;
      this->basex = (FxExpression *)0x0;
      if (this != (FxClassPtrCast *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
    }
    else {
      dtype = (PClassPointer *)(this->super_FxExpression).ValueType;
      pMVar5 = PType::GetClass(this->basex->ValueType);
      if (pMVar5 == (MetaClass *)PClassPointer::RegistrationInfo.MyClass) {
        pPVar1 = this->basex->ValueType;
        bVar3 = PClass::IsDescendantOf
                          ((PClass *)pPVar1[1].super_PTypeBase.super_DObject.ObjNext,
                           dtype->ClassRestriction);
        if (bVar3) {
          this->basex->ValueType = (PType *)dtype;
          pFVar2 = this->basex;
          this->basex = (FxExpression *)0x0;
          if (this == (FxClassPtrCast *)0x0) {
            return pFVar2;
          }
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
          return pFVar2;
        }
        bVar3 = PClass::IsDescendantOf
                          (dtype->ClassRestriction,
                           (PClass *)pPVar1[1].super_PTypeBase.super_DObject.ObjNext);
        if (bVar3) {
          return &this->super_FxExpression;
        }
      }
      else if ((this->basex->ValueType == (PType *)TypeString) ||
              (this->basex->ValueType == (PType *)TypeName)) {
        this_00 = (FxClassTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
        FxClassTypeCast::FxClassTypeCast(this_00,dtype,this->basex);
        this->basex = (FxExpression *)0x0;
        if (this != (FxClassPtrCast *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        iVar4 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
        return (FxExpression *)CONCAT44(extraout_var_00,iVar4);
      }
      pcVar6 = PType::DescriptiveName(this->basex->ValueType);
      pcVar7 = PType::DescriptiveName((PType *)dtype);
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,
                 "Cannot cast %s to %s. The types are incompatible.",pcVar6,pcVar7);
      if (this != (FxClassPtrCast *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxClassPtrCast *)0x0;
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxClassPtrCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeNullPtr)
	{
		basex->ValueType = ValueType;
		auto x = basex;
		basex = nullptr;
		delete this;
		return x;
	}
	auto to = static_cast<PClassPointer *>(ValueType);
	if (basex->ValueType->GetClass() == RUNTIME_CLASS(PClassPointer))
	{
		auto from = static_cast<PClassPointer *>(basex->ValueType);
		// Downcast is always ok.
		if (from->ClassRestriction->IsDescendantOf(to->ClassRestriction))
		{
			basex->ValueType = to;
			auto x = basex;
			basex = nullptr;
			delete this;
			return x;
		}
		// Upcast needs a runtime check.
		else if (to->ClassRestriction->IsDescendantOf(from->ClassRestriction))
		{
			return this;
		}
	}
	else if (basex->ValueType == TypeString || basex->ValueType == TypeName)
	{
		FxExpression *x = new FxClassTypeCast(to, basex);
		basex = nullptr;
		delete this;
		return x->Resolve(ctx);
	}
	// Everything else is an error.
	ScriptPosition.Message(MSG_ERROR, "Cannot cast %s to %s. The types are incompatible.", basex->ValueType->DescriptiveName(), to->DescriptiveName());
	delete this;
	return nullptr;
}